

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

int __thiscall METADemuxer::readPacket(METADemuxer *this,AVPacket *avPacket)

{
  size_t sVar1;
  pointer pSVar2;
  AbstractStreamReader *pAVar3;
  _func_int **pp_Var4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ssize_t sVar8;
  size_t __nbytes;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long lVar9;
  void *extraout_RDX_02;
  long lVar10;
  AVPacket *pAVar11;
  ContainerToReaderWrapper *this_00;
  StreamInfo *si;
  long lVar12;
  pointer pSVar13;
  size_t sVar14;
  bool bVar15;
  int minDtsIndex;
  int local_40;
  int local_3c;
  
  sVar14 = 0x7fffffffffffffff;
  avPacket->codec = (BaseAbstractStreamReader *)0x0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->stream_index = 0;
  this->m_lastReadRez = 0;
  bVar5 = true;
  local_40 = -1;
  pAVar11 = avPacket;
LAB_001a3885:
  do {
    pSVar13 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __nbytes = 6;
    if (0 < (int)((ulong)((long)(this->m_codecInfo).
                                super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pSVar13) >> 4) *
            -0xf0f0f0f) {
      lVar10 = 0;
      lVar12 = 0;
      do {
        if (this->m_flushDataMode == false) {
          sVar8 = StreamInfo::read((StreamInfo *)((long)&pSVar13->m_dataReader + lVar10),
                                   (int)pAVar11,in_RDX,__nbytes);
          iVar7 = (int)sVar8;
          *(int *)((long)&pSVar13->lastReadRez + lVar10) = iVar7;
          in_RDX = extraout_RDX;
          if (iVar7 != 4) {
            if (iVar7 == 3) goto LAB_001a38bc;
            if (iVar7 != 2) {
              sVar1 = *(size_t *)((long)&pSVar13->m_lastDTS + lVar10);
              if ((long)sVar1 < (long)sVar14) {
                sVar14 = sVar1;
                local_40 = (int)lVar12;
              }
              goto LAB_001a3933;
            }
            this->m_lastReadRez = 2;
            local_3c = 2;
            uVar6 = 1;
            goto LAB_001a3939;
          }
          uVar6 = 8;
        }
        else {
LAB_001a38bc:
          __nbytes = *(size_t *)((long)&pSVar13->m_lastDTS + lVar10);
          uVar6 = 0;
          if ((long)__nbytes < (long)sVar14) {
            if ((&pSVar13->m_flushed)[lVar10] == false) {
              sVar14 = __nbytes;
              local_40 = (int)lVar12;
            }
LAB_001a3933:
            uVar6 = 0;
          }
LAB_001a3939:
          bVar5 = false;
        }
        if ((uVar6 & 7) != 0) {
          __nbytes = (size_t)uVar6;
          goto LAB_001a3986;
        }
        lVar12 = lVar12 + 1;
        pSVar13 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x110;
      } while (lVar12 < (int)((ulong)((long)(this->m_codecInfo).
                                            super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar13) >> 4) * -0xf0f0f0f);
      __nbytes = 6;
    }
LAB_001a3986:
    if ((int)__nbytes == 6) {
      if (bVar5) {
        pSVar2 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar13 = (this->m_codecInfo).
                       super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
                       super__Vector_impl_data._M_start; pSVar13 != pSVar2; pSVar13 = pSVar13 + 1) {
          this_00 = (ContainerToReaderWrapper *)pSVar13->m_dataReader;
          if ((this_00 == (ContainerToReaderWrapper *)0x0) ||
             ((this_00->super_AbstractReader)._vptr_AbstractReader !=
              (_func_int **)&PTR__ContainerToReaderWrapper_00241250)) {
            this_00 = (ContainerToReaderWrapper *)0x0;
          }
          if (this_00 != (ContainerToReaderWrapper *)0x0) {
            ContainerToReaderWrapper::resetDelayedMark(this_00);
            in_RDX = extraout_RDX_00;
          }
        }
      }
      if (bVar5) goto LAB_001a3885;
      if (local_40 == -1) {
        if (this->m_flushDataMode == false) {
          this->m_flushDataMode = true;
          bVar15 = true;
        }
        else {
          bVar15 = false;
          pAVar11 = (AVPacket *)0x0;
          updateReport(this,false);
          this->m_lastReadRez = 1;
          local_3c = 1;
          in_RDX = extraout_RDX_01;
        }
      }
      else {
        lVar10 = (long)local_40;
        if (this->m_flushDataMode == false) {
          pSVar13 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar3 = pSVar13[lVar10].m_streamReader;
          pp_Var4 = (pAVar3->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader;
          if (pSVar13[lVar10].lastReadRez == 3) {
            (*pp_Var4[7])();
            (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10].m_flushed = true;
          }
          else {
            iVar7 = (*pp_Var4[6])(pAVar3,avPacket);
            (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10].m_lastAVRez = iVar7;
          }
          pSVar13 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar12 = pSVar13[lVar10].m_timeShift;
          lVar9 = avPacket->dts + lVar12;
          avPacket->dts = lVar9;
          avPacket->pts = avPacket->pts + lVar12;
          pSVar13[lVar10].m_lastDTS = lVar9 + avPacket->duration;
        }
        else {
          pAVar3 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar10].m_streamReader;
          (*(pAVar3->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[7])
                    (pAVar3,avPacket);
          (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10].m_flushed = true;
        }
        pAVar11 = (AVPacket *)0x1;
        updateReport(this,true);
        bVar15 = false;
        local_3c = 0;
        in_RDX = extraout_RDX_02;
      }
    }
    else {
      bVar15 = (int)__nbytes == 0;
    }
    local_40 = -1;
    sVar14 = 0x7fffffffffffffff;
    bVar5 = true;
    if (!bVar15) {
      return local_3c;
    }
  } while( true );
}

Assistant:

int METADemuxer::readPacket(AVPacket& avPacket)

{
    avPacket.stream_index = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.codec = nullptr;
    m_lastReadRez = 0;
    while (true)
    {
        int minDtsIndex = -1;
        int64_t minDts = LLONG_MAX;
        bool allDataDelayed = true;
        while (allDataDelayed)
        {
            for (int i = 0; i < static_cast<int>(m_codecInfo.size()); i++)
            {
                StreamInfo& streamInfo = m_codecInfo[i];
                if (!m_flushDataMode)
                {
                    streamInfo.lastReadRez = streamInfo.read();
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_DELAYED)
                        continue;  // skip stream
                    allDataDelayed = false;
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_NOT_READY)
                    {
                        m_lastReadRez = BufferedFileReader::DATA_NOT_READY;
                        return BufferedFileReader::DATA_NOT_READY;
                    }
                    if (streamInfo.lastReadRez != BufferedFileReader::DATA_EOF2)
                    {
                        if (streamInfo.m_lastDTS < minDts)
                        {
                            minDtsIndex = i;
                            minDts = streamInfo.m_lastDTS;
                        }
                    }
                    else if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
                else
                {
                    allDataDelayed = false;
                    if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
            }
            if (allDataDelayed)
                for (const StreamInfo& si : m_codecInfo)
                {
                    const auto cReader = dynamic_cast<ContainerToReaderWrapper*>(si.m_dataReader);
                    if (cReader)
                        cReader->resetDelayedMark();
                }
        }
        if (minDtsIndex != -1)
        {
            if (!m_flushDataMode)
            {
                if (m_codecInfo[minDtsIndex].lastReadRez != BufferedFileReader::DATA_EOF2)
                {
                    const int res = m_codecInfo[minDtsIndex].m_streamReader->readPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_lastAVRez = res;
                }
                else
                {
                    // flush single stream
                    m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_flushed = true;
                }
                // add time shift from external sync source
                // add static time shift
                avPacket.dts += m_codecInfo[minDtsIndex].m_timeShift;
                avPacket.pts += m_codecInfo[minDtsIndex].m_timeShift;
                m_codecInfo[minDtsIndex].m_lastDTS = avPacket.dts + avPacket.duration;
            }
            else
            {  // flush all streams
                m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                m_codecInfo[minDtsIndex].m_flushed = true;
            }
            updateReport(true);
            return 0;
        }
        if (!m_flushDataMode)
            m_flushDataMode = true;
        else
        {
            updateReport(false);
            m_lastReadRez = BufferedFileReader::DATA_EOF;
            return BufferedReader::DATA_EOF;
        }
    }
}